

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::delete_node
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          AlexNode<int,_int> *node)

{
  ulong uVar1;
  
  if (node != (AlexNode<int,_int> *)0x0) {
    if (node->is_leaf_ == true) {
      (**node->_vptr_AlexNode)(node);
      uVar1 = 200;
    }
    else {
      (**node->_vptr_AlexNode)(node);
      uVar1 = 0x40;
    }
    operator_delete(node,uVar1);
    return;
  }
  return;
}

Assistant:

void delete_node(AlexNode<T, P>* node) {
    if (node == nullptr) {
      return;
    } else if (node->is_leaf_) {
      data_node_allocator().destroy(static_cast<data_node_type*>(node));
      data_node_allocator().deallocate(static_cast<data_node_type*>(node), 1);
    } else {
      model_node_allocator().destroy(static_cast<model_node_type*>(node));
      model_node_allocator().deallocate(static_cast<model_node_type*>(node), 1);
    }
  }